

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS ref_node_implicit_global_from_local(REF_NODE ref_node)

{
  int iVar1;
  REF_MPI ref_mpi;
  REF_GLOB *pRVar2;
  uint uVar3;
  void *array;
  REF_GLOB *vector;
  long lVar4;
  undefined8 uVar5;
  REF_STATUS RVar6;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  REF_GLOB nnode;
  long local_30;
  
  ref_mpi = ref_node->ref_mpi;
  uVar3 = ref_node_synchronize_globals(ref_node);
  if (uVar3 != 0) {
    pcVar9 = "sync";
    uVar5 = 0x308;
LAB_0017d8be:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar5,
           "ref_node_implicit_global_from_local",(ulong)uVar3,pcVar9);
    return uVar3;
  }
  local_30 = 0;
  if (0 < (long)ref_node->max) {
    lVar4 = 0;
    lVar7 = 0;
    do {
      if ((-1 < ref_node->global[lVar7]) && (ref_node->ref_mpi->id == ref_node->part[lVar7])) {
        lVar4 = lVar4 + 1;
        local_30 = lVar4;
      }
      lVar7 = lVar7 + 1;
    } while (ref_node->max != lVar7);
  }
  if ((long)ref_mpi->n < 0) {
    pcVar9 = "malloc everyones_nnode of REF_GLOB negative";
    uVar5 = 0x311;
LAB_0017d9c0:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar5,
           "ref_node_implicit_global_from_local",pcVar9);
    RVar6 = 1;
  }
  else {
    array = malloc((long)ref_mpi->n << 3);
    if (array == (void *)0x0) {
      pcVar9 = "malloc everyones_nnode of REF_GLOB NULL";
      uVar5 = 0x311;
    }
    else {
      uVar3 = ref_mpi_allgather(ref_mpi,&local_30,array,2);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0x313,"ref_node_implicit_global_from_local",(ulong)uVar3,"allgather");
        return uVar3;
      }
      if ((long)ref_mpi->id < 1) {
        lVar4 = 0;
      }
      else {
        lVar7 = 0;
        lVar4 = 0;
        do {
          lVar4 = lVar4 + *(long *)((long)array + lVar7 * 8);
          lVar7 = lVar7 + 1;
        } while (ref_mpi->id != lVar7);
      }
      free(array);
      uVar3 = ref_node->max;
      if ((long)(int)uVar3 < 0) {
        pcVar9 = "malloc global of REF_GLOB negative";
        uVar5 = 0x31a;
        goto LAB_0017d9c0;
      }
      vector = (REF_GLOB *)malloc((long)(int)uVar3 * 8);
      if (vector != (REF_GLOB *)0x0) {
        local_30 = 0;
        if (uVar3 != 0) {
          lVar7 = 0;
          pRVar2 = ref_node->global;
          uVar8 = 0;
          do {
            if ((-1 < pRVar2[uVar8]) && (ref_node->ref_mpi->id == ref_node->part[uVar8])) {
              vector[uVar8] = lVar7 + lVar4;
              lVar7 = lVar7 + 1;
              local_30 = lVar7;
            }
            uVar8 = uVar8 + 1;
          } while (uVar3 != uVar8);
        }
        uVar3 = ref_node_ghost_glob(ref_node,vector,1);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0x324,"ref_node_implicit_global_from_local",(ulong)uVar3,"ghost int");
          return uVar3;
        }
        iVar1 = ref_node->max;
        if (0 < (long)iVar1) {
          pRVar2 = ref_node->global;
          lVar4 = 0;
          do {
            if (-1 < pRVar2[lVar4]) {
              pRVar2[lVar4] = vector[lVar4];
            }
            lVar4 = lVar4 + 1;
          } while (iVar1 != lVar4);
        }
        free(vector);
        uVar3 = ref_node_rebuild_sorted_global(ref_node);
        if (uVar3 == 0) {
          return 0;
        }
        pcVar9 = "rebuild globals";
        uVar5 = 0x32c;
        goto LAB_0017d8be;
      }
      pcVar9 = "malloc global of REF_GLOB NULL";
      uVar5 = 0x31a;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar5,
           "ref_node_implicit_global_from_local",pcVar9);
    RVar6 = 2;
  }
  return RVar6;
}

Assistant:

REF_FCN REF_STATUS ref_node_implicit_global_from_local(REF_NODE ref_node) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT node, proc;
  REF_GLOB nnode, *global;
  REF_GLOB *everyones_nnode, offset;

  RSS(ref_node_synchronize_globals(ref_node), "sync");

  nnode = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      nnode++;
    }
  }

  ref_malloc(everyones_nnode, ref_mpi_n(ref_mpi), REF_GLOB);
  RSS(ref_mpi_allgather(ref_mpi, &nnode, everyones_nnode, REF_GLOB_TYPE),
      "allgather");

  offset = 0;
  for (proc = 0; proc < ref_mpi_rank(ref_mpi); proc++)
    offset += everyones_nnode[proc];

  ref_free(everyones_nnode);
  ref_malloc(global, ref_node_max(ref_node), REF_GLOB);

  nnode = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      global[node] = offset + nnode;
      nnode++;
    }
  }

  RSS(ref_node_ghost_glob(ref_node, global, 1), "ghost int");

  each_ref_node_valid_node(ref_node, node) {
    ref_node->global[node] = global[node];
  }

  ref_free(global);

  RSS(ref_node_rebuild_sorted_global(ref_node), "rebuild globals");

  return REF_SUCCESS;
}